

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *p,int level,word *pTruth,word *pResult)

{
  ulong uVar1;
  Vec_Mem_t *pVVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  uint *puVar5;
  int *piVar6;
  word **ppwVar7;
  word *pwVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  size_t __size;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar14;
  
  if (p == (Abc_TtHieMan_t *)0x0) {
    return -1;
  }
  uVar17 = (ulong)(uint)level;
  if (level < 0) {
    uVar17 = (ulong)(level + p->nLastLevel + 1);
  }
  iVar11 = (int)uVar17;
  if (iVar11 < 0) {
    return -1;
  }
  if (p->nLastLevel < iVar11) {
    return -1;
  }
  puVar5 = (uint *)Vec_MemHashLookup(p->vTtMem[uVar17],pTruth);
  uVar12 = *puVar5;
  if (uVar12 == 0xffffffff) {
    pVVar2 = p->vTtMem[uVar17];
    pVVar3 = pVVar2->vTable;
    if (pVVar3->nSize < pVVar2->nEntries) {
      uVar15 = (ulong)(pVVar3->nSize * 2 - 1);
      while( true ) {
        do {
          uVar12 = (uint)uVar15;
          uVar13 = uVar12 + 1;
          uVar14 = (ulong)uVar13;
          uVar1 = uVar15 & 1;
          uVar15 = uVar14;
        } while (uVar1 != 0);
        if (uVar13 < 9) break;
        iVar9 = 5;
        while (uVar13 % (iVar9 - 2U) != 0) {
          uVar4 = iVar9 * iVar9;
          iVar9 = iVar9 + 2;
          if (uVar13 < uVar4) goto LAB_004fe01a;
        }
      }
LAB_004fe01a:
      if (pVVar3->nCap < (int)uVar13) {
        if (pVVar3->pArray == (int *)0x0) {
          piVar6 = (int *)malloc((long)(int)uVar13 << 2);
        }
        else {
          piVar6 = (int *)realloc(pVVar3->pArray,(long)(int)uVar13 << 2);
        }
        pVVar3->pArray = piVar6;
        if (piVar6 == (int *)0x0) {
LAB_004fe486:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar3->nCap = uVar13;
      }
      if (uVar12 < 0x7fffffff) {
        memset(pVVar3->pArray,0xff,uVar14 << 2);
      }
      pVVar3->nSize = uVar13;
      pVVar2->vNexts->nSize = 0;
      iVar9 = pVVar2->nEntries;
      if ((0 < iVar9) && (pwVar8 = *pVVar2->ppPages, pwVar8 != (word *)0x0)) {
        uVar12 = 1;
        do {
          piVar6 = Vec_MemHashLookup(pVVar2,pwVar8 + (long)pVVar2->nEntrySize *
                                                     (long)(int)(uVar12 - 1 & pVVar2->PageMask));
          if (*piVar6 != -1) {
            __assert_fail("*pSpot == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
          pVVar3 = pVVar2->vNexts;
          *piVar6 = pVVar3->nSize;
          Vec_IntPush(pVVar3,-1);
          iVar9 = pVVar2->nEntries;
          if (iVar9 <= (int)uVar12) break;
          pwVar8 = pVVar2->ppPages[uVar12 >> ((byte)pVVar2->LogPageSze & 0x1f)];
          uVar12 = uVar12 + 1;
        } while (pwVar8 != (word *)0x0);
      }
      if (iVar9 != pVVar2->vNexts->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    puVar5 = (uint *)Vec_MemHashLookup(pVVar2,pTruth);
    uVar12 = *puVar5;
    if (uVar12 == 0xffffffff) {
      pVVar3 = pVVar2->vNexts;
      *puVar5 = pVVar3->nSize;
      Vec_IntPush(pVVar3,-1);
      uVar12 = pVVar2->nEntries;
      if ((int)uVar12 < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      uVar13 = uVar12 >> ((byte)pVVar2->LogPageSze & 0x1f);
      if (pVVar2->iPage < (int)uVar13) {
        iVar9 = pVVar2->nPageAlloc;
        if (iVar9 <= (int)uVar13) {
          iVar10 = uVar13 + 0x20;
          if (iVar9 != 0) {
            iVar10 = iVar9 * 2;
          }
          pVVar2->nPageAlloc = iVar10;
          if (pVVar2->ppPages == (word **)0x0) {
            ppwVar7 = (word **)malloc((long)iVar10 * 8);
          }
          else {
            ppwVar7 = (word **)realloc(pVVar2->ppPages,(long)iVar10 * 8);
          }
          pVVar2->ppPages = ppwVar7;
        }
        if (pVVar2->iPage < (int)uVar13) {
          iVar9 = pVVar2->nEntrySize;
          iVar10 = pVVar2->LogPageSze;
          uVar15 = (long)pVVar2->iPage;
          do {
            uVar1 = uVar15 + 1;
            pwVar8 = (word *)malloc((long)(iVar9 << ((byte)iVar10 & 0x1f)) << 3);
            pVVar2->ppPages[uVar15 + 1] = pwVar8;
            uVar15 = uVar1;
          } while (uVar13 != uVar1);
        }
        pVVar2->iPage = uVar13;
      }
      pVVar2->nEntries = uVar12 + 1;
      memmove(pVVar2->ppPages[uVar12 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
              (long)(int)(pVVar2->PageMask & uVar12) * (long)pVVar2->nEntrySize,pTruth,
              (long)pVVar2->nEntrySize << 3);
      iVar9 = pVVar2->vNexts->nSize;
      if (pVVar2->nEntries != iVar9) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
      uVar12 = iVar9 - 1;
    }
    p->vTruthId[uVar17] = uVar12;
    if (iVar11 < p->nLastLevel) {
      return 0;
    }
  }
  if (iVar11 < p->nLastLevel) {
    if (((int)uVar12 < 0) || (p->vRepres[uVar17]->nSize <= (int)uVar12)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar12 = p->vRepres[uVar17]->pArray[uVar12];
  }
  if (iVar11 != 0) {
    uVar15 = 1;
    if (1 < iVar11) {
      uVar15 = uVar17;
    }
    uVar17 = 0;
    do {
      pVVar3 = p->vRepres[uVar17];
      uVar13 = p->vTruthId[uVar17];
      if (pVVar3->nSize <= (int)uVar13) {
        iVar9 = pVVar3->nCap;
        iVar10 = iVar9 * 2;
        iVar16 = (int)((long)(int)uVar13 + 1);
        if ((int)uVar13 < iVar10) {
          if (iVar9 < iVar10 && iVar9 <= (int)uVar13) {
            if (pVVar3->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((long)iVar9 << 3);
            }
            else {
              piVar6 = (int *)realloc(pVVar3->pArray,(long)iVar9 << 3);
            }
            pVVar3->pArray = piVar6;
LAB_004fe322:
            if (piVar6 == (int *)0x0) goto LAB_004fe486;
            pVVar3->nCap = iVar10;
          }
        }
        else if (iVar9 <= (int)uVar13) {
          __size = ((long)(int)uVar13 + 1) * 4;
          if (pVVar3->pArray == (int *)0x0) {
            piVar6 = (int *)malloc(__size);
          }
          else {
            piVar6 = (int *)realloc(pVVar3->pArray,__size);
          }
          pVVar3->pArray = piVar6;
          iVar10 = iVar16;
          goto LAB_004fe322;
        }
        iVar9 = pVVar3->nSize;
        if (iVar9 <= (int)uVar13) {
          memset(pVVar3->pArray + iVar9,0,(ulong)(uVar13 - iVar9) * 4 + 4);
        }
        pVVar3->nSize = iVar16;
      }
      if (((int)uVar13 < 0) || (pVVar3->nSize <= (int)uVar13)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar3->pArray[uVar13] = uVar12;
      uVar17 = uVar17 + 1;
    } while (uVar15 != uVar17);
  }
  if (-1 < (int)uVar12) {
    pVVar2 = p->vTtMem[p->nLastLevel];
    if ((int)uVar12 < pVVar2->nEntries) {
      iVar9 = (uVar12 & pVVar2->PageMask) * pVVar2->nEntrySize;
      pwVar8 = pVVar2->ppPages[uVar12 >> ((byte)pVVar2->LogPageSze & 0x1f)];
      uVar12 = p->nWords;
      uVar17 = (ulong)uVar12;
      if (iVar11 < p->nLastLevel) {
        if (0 < (int)uVar12) {
          uVar15 = 0;
          do {
            pResult[uVar15] = pwVar8[(long)iVar9 + uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar17 != uVar15);
          return 1;
        }
        return 1;
      }
      if (0 < (int)uVar12) {
        uVar15 = 0;
        do {
          if (pTruth[uVar15] != pwVar8[(long)iVar9 + uVar15]) {
            __assert_fail("Abc_TtEqual(pTruth, pRepTruth, p->nWords)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                          ,0x51b,
                          "int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *, int, word *, word *)");
          }
          uVar15 = uVar15 + 1;
        } while (uVar17 != uVar15);
      }
      if (pTruth == pResult || (int)uVar12 < 1) {
        return 0;
      }
      uVar15 = 0;
      do {
        pResult[uVar15] = pwVar8[(long)iVar9 + uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
      return 0;
    }
  }
  __assert_fail("i >= 0 && i < p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
}

Assistant:

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t * p, int level, word * pTruth, word * pResult)
{
    int i, iSpot, truthId;
    word * pRepTruth;
    if (!p) return -1;
    if (level < 0) level += p->nLastLevel + 1;
    if (level < 0 || level > p->nLastLevel) return -1;
    iSpot = *Vec_MemHashLookup(p->vTtMem[level], pTruth);
    if (iSpot == -1) {
        p->vTruthId[level] = Vec_MemHashInsert(p->vTtMem[level], pTruth);
        if (level < p->nLastLevel) return 0;
        iSpot = p->vTruthId[level];
    }
    // return the class representative
    if (level < p->nLastLevel)
        truthId = Vec_IntEntry(p->vRepres[level], iSpot);
    else
        truthId = iSpot;
    for (i = 0; i < level; i++)
        Vec_IntSetEntry(p->vRepres[i], p->vTruthId[i], truthId);

    pRepTruth = Vec_MemReadEntry(p->vTtMem[p->nLastLevel], truthId);
    if (level < p->nLastLevel) {
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
        return 1;
    }
    assert(Abc_TtEqual(pTruth, pRepTruth, p->nWords));
    if (pTruth != pResult)
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
    return 0;
}